

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_aggsig_verify_single
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,secp256k1_pubkey *pubnonce,
              secp256k1_pubkey *pubkey,secp256k1_pubkey *pubkey_total,secp256k1_pubkey *extra_pubkey
              ,int is_partial)

{
  int iVar1;
  secp256k1_scratch *scratch;
  int overflow;
  secp256k1_fe r_x;
  secp256k1_verify_callback_data cbdata;
  secp256k1_scalar g_sc;
  secp256k1_scalar sighash;
  secp256k1_gej pk_sum;
  secp256k1_ge tmp_ge;
  secp256k1_ge pk_sum_ge;
  int local_28c;
  secp256k1_fe local_288;
  secp256k1_context *local_258 [5];
  uint64_t local_230;
  uint64_t uStack_228;
  uint64_t local_220;
  uint64_t uStack_218;
  secp256k1_pubkey *local_210;
  secp256k1_scalar local_208;
  secp256k1_scalar local_1e8;
  secp256k1_gej local_1c8;
  secp256k1_fe local_148;
  secp256k1_ge local_120;
  secp256k1_ge_storage local_c8;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_aggsig_verify_single_cold_1();
  }
  else {
    iVar1 = secp256k1_fe_set_b32(&local_288,sig64);
    if (iVar1 == 0) {
      return 0;
    }
    secp256k1_scalar_set_b32(&local_208,sig64 + 0x20,&local_28c);
    if (local_28c == 0) {
      if (pubnonce == (secp256k1_pubkey *)0x0) {
        secp256k1_ge_set_xquad(&local_120,&local_288);
        pubnonce = (secp256k1_pubkey *)&local_c8;
        secp256k1_ge_to_storage((secp256k1_ge_storage *)pubnonce,&local_120);
      }
      secp256k1_compute_sighash_single(ctx,&local_1e8,pubnonce,pubkey_total,msg32);
      local_230 = local_1e8.d[0];
      uStack_228 = local_1e8.d[1];
      local_220 = local_1e8.d[2];
      uStack_218 = local_1e8.d[3];
      local_258[0] = ctx;
      local_210 = pubkey;
      scratch = (secp256k1_scratch *)calloc(1,0x90);
      if (scratch == (secp256k1_scratch *)0x0) {
        (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
      }
      else {
        scratch->max_size = 0x400000;
        scratch->error_callback = &ctx->error_callback;
        iVar1 = secp256k1_ecmult_multi_var
                          (&ctx->ecmult_ctx,scratch,&local_1c8,&local_208,
                           secp256k1_aggsig_verify_callback_single,local_258,1);
        free(scratch);
        if (iVar1 != 0) {
          if (extra_pubkey != (secp256k1_pubkey *)0x0) {
            secp256k1_pubkey_load(ctx,&local_120,extra_pubkey);
            secp256k1_ge_neg(&local_120,&local_120);
            secp256k1_gej_add_ge(&local_1c8,&local_1c8,&local_120);
          }
          secp256k1_ge_set_gej(&local_88,&local_1c8);
          local_148.n[0] = (local_88.x.n[0] - local_288.n[0]) + 0x3ffffbfffff0bc;
          local_148.n[1] = (local_88.x.n[1] - local_288.n[1]) + 0x3ffffffffffffc;
          local_148.n[2] = (local_88.x.n[2] - local_288.n[2]) + 0x3ffffffffffffc;
          local_148.n[3] = (local_88.x.n[3] - local_288.n[3]) + 0x3ffffffffffffc;
          local_148.n[4] = (local_88.x.n[4] - local_288.n[4]) + 0x3fffffffffffc;
          iVar1 = secp256k1_fe_normalizes_to_zero_var(&local_148);
          if (is_partial != 0) {
            return iVar1;
          }
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = secp256k1_gej_has_quad_y_var(&local_1c8);
          return iVar1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_aggsig_verify_single(
    const secp256k1_context* ctx,
    const unsigned char *sig64,
    const unsigned char *msg32,
    const secp256k1_pubkey *pubnonce,
    const secp256k1_pubkey *pubkey,
    const secp256k1_pubkey *pubkey_total,
    const secp256k1_pubkey *extra_pubkey,
    const int is_partial){

    secp256k1_scalar g_sc;
    secp256k1_fe r_x;
    secp256k1_gej pk_sum;
    secp256k1_ge pk_sum_ge;
    secp256k1_scalar sighash;
    secp256k1_scratch_space *scratch;
    secp256k1_verify_callback_data cbdata;
    secp256k1_ge tmp_ge;
    secp256k1_pubkey tmp_pk;

    int overflow;
    int return_check=0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(pubkey != NULL);

    /* extract R */
    if (!secp256k1_fe_set_b32(&r_x, sig64)) {
        return 0;
    }

    /* extract s */
    secp256k1_scalar_set_b32(&g_sc, sig64 + 32, &overflow);
    if (overflow) {
        return 0;
    }

    /* compute e = sighash */
    if (pubnonce != NULL) {
        secp256k1_compute_sighash_single(ctx, &sighash, pubnonce, pubkey_total, msg32);
    } else {
        secp256k1_ge_set_xquad(&tmp_ge, &r_x);
        secp256k1_pubkey_save(&tmp_pk, &tmp_ge);
        secp256k1_compute_sighash_single(ctx, &sighash, &tmp_pk, pubkey_total, msg32);
    }

    /* Populate callback data */
    cbdata.ctx = ctx;
    cbdata.pubkeys = pubkey;
    cbdata.single_hash = sighash;

    scratch = secp256k1_scratch_space_create(ctx, 1024*4096);
    if (scratch == NULL){
        return 0;
    }
    
    /* Compute sG - eP, which should be R */
    if (!secp256k1_ecmult_multi_var(&ctx->ecmult_ctx, scratch, &pk_sum, &g_sc, secp256k1_aggsig_verify_callback_single, &cbdata, 1)) {
        secp256k1_scratch_space_destroy(scratch);
        return 0;
    }

    secp256k1_scratch_space_destroy(scratch);

    if (extra_pubkey != NULL) {
        /* Subtract an extra public key */
        secp256k1_pubkey_load(ctx, &tmp_ge, extra_pubkey);
        secp256k1_ge_neg(&tmp_ge, &tmp_ge);
        secp256k1_gej_add_ge(&pk_sum, &pk_sum, &tmp_ge);
    }

    secp256k1_ge_set_gej(&pk_sum_ge, &pk_sum);

    return_check = secp256k1_fe_equal_var(&r_x, &pk_sum_ge.x);
    if (!is_partial){
        return return_check && secp256k1_gej_has_quad_y_var(&pk_sum);
    } else {
        return return_check;
    }

}